

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O2

shared_ptr<const_tchecker::typed_expression_t> __thiscall
tchecker::typed_if_statement_t::condition_ptr(typed_if_statement_t *this)

{
  shared_ptr<const_tchecker::typed_expression_t> sVar1;
  
  sVar1 = std::dynamic_pointer_cast<tchecker::typed_expression_t_const,tchecker::expression_t_const>
                    ((shared_ptr<const_tchecker::expression_t> *)this);
  sVar1.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_tchecker::typed_expression_t>)
         sVar1.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<tchecker::typed_expression_t const> typed_if_statement_t::condition_ptr() const
{
  return std::dynamic_pointer_cast<tchecker::typed_expression_t const>(tchecker::if_statement_t::condition_ptr());
}